

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuObjIterNext(sqlite3rbu *p,RbuObjIter *pIter)

{
  int iVar1;
  uchar *puVar2;
  bool bVar3;
  sqlite3_stmt *pIdx;
  int rc;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  pIdx._4_4_ = p->rc;
  if (pIdx._4_4_ == 0) {
    rbuObjIterClearStatements(pIter);
    if (pIter->zIdx == (char *)0x0) {
      pIdx._4_4_ = sqlite3_exec(p->dbMain,
                                "DROP TRIGGER IF EXISTS temp.rbu_insert_tr;DROP TRIGGER IF EXISTS temp.rbu_update1_tr;DROP TRIGGER IF EXISTS temp.rbu_update2_tr;DROP TRIGGER IF EXISTS temp.rbu_delete_tr;"
                                ,(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
    }
    if (pIdx._4_4_ == 0) {
      if (pIter->bCleanup == 0) {
        if (pIter->zIdx == (char *)0x0) {
          pIdx._4_4_ = sqlite3_bind_text(pIter->pIdxIter,1,pIter->zTbl,-1,(_func_void_void_ptr *)0x0
                                        );
        }
        if (pIdx._4_4_ == 0) {
          iVar1 = sqlite3_step(pIter->pIdxIter);
          if (iVar1 == 100) {
            puVar2 = sqlite3_column_text(pIter->pIdxIter,0);
            pIter->zIdx = (char *)puVar2;
            iVar1 = sqlite3_column_int(pIter->pIdxIter,1);
            pIter->iTnum = iVar1;
            iVar1 = sqlite3_column_int(pIter->pIdxIter,2);
            pIter->bUnique = iVar1;
            pIdx._4_4_ = 7;
            if (pIter->zIdx != (char *)0x0) {
              pIdx._4_4_ = 0;
            }
          }
          else {
            pIdx._4_4_ = resetAndCollectError(pIter->pIdxIter,&p->zErrmsg);
            pIter->bCleanup = 1;
            pIter->zIdx = (char *)0x0;
          }
        }
      }
      else {
        rbuObjIterFreeCols(pIter);
        pIter->bCleanup = 0;
        iVar1 = sqlite3_step(pIter->pTblIter);
        if (iVar1 == 100) {
          puVar2 = sqlite3_column_text(pIter->pTblIter,0);
          pIter->zTbl = (char *)puVar2;
          puVar2 = sqlite3_column_text(pIter->pTblIter,1);
          pIter->zDataTbl = (char *)puVar2;
          bVar3 = false;
          if (pIter->zDataTbl != (char *)0x0) {
            bVar3 = pIter->zTbl != (char *)0x0;
          }
          pIdx._4_4_ = 7;
          if (bVar3) {
            pIdx._4_4_ = 0;
          }
        }
        else {
          pIdx._4_4_ = resetAndCollectError(pIter->pTblIter,&p->zErrmsg);
          pIter->zTbl = (char *)0x0;
        }
      }
    }
  }
  if (pIdx._4_4_ != 0) {
    rbuObjIterFinalize(pIter);
    p->rc = pIdx._4_4_;
  }
  return pIdx._4_4_;
}

Assistant:

static int rbuObjIterNext(sqlite3rbu *p, RbuObjIter *pIter){
  int rc = p->rc;
  if( rc==SQLITE_OK ){

    /* Free any SQLite statements used while processing the previous object */ 
    rbuObjIterClearStatements(pIter);
    if( pIter->zIdx==0 ){
      rc = sqlite3_exec(p->dbMain,
          "DROP TRIGGER IF EXISTS temp.rbu_insert_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_update1_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_update2_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_delete_tr;"
          , 0, 0, &p->zErrmsg
      );
    }

    if( rc==SQLITE_OK ){
      if( pIter->bCleanup ){
        rbuObjIterFreeCols(pIter);
        pIter->bCleanup = 0;
        rc = sqlite3_step(pIter->pTblIter);
        if( rc!=SQLITE_ROW ){
          rc = resetAndCollectError(pIter->pTblIter, &p->zErrmsg);
          pIter->zTbl = 0;
        }else{
          pIter->zTbl = (const char*)sqlite3_column_text(pIter->pTblIter, 0);
          pIter->zDataTbl = (const char*)sqlite3_column_text(pIter->pTblIter,1);
          rc = (pIter->zDataTbl && pIter->zTbl) ? SQLITE_OK : SQLITE_NOMEM;
        }
      }else{
        if( pIter->zIdx==0 ){
          sqlite3_stmt *pIdx = pIter->pIdxIter;
          rc = sqlite3_bind_text(pIdx, 1, pIter->zTbl, -1, SQLITE_STATIC);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3_step(pIter->pIdxIter);
          if( rc!=SQLITE_ROW ){
            rc = resetAndCollectError(pIter->pIdxIter, &p->zErrmsg);
            pIter->bCleanup = 1;
            pIter->zIdx = 0;
          }else{
            pIter->zIdx = (const char*)sqlite3_column_text(pIter->pIdxIter, 0);
            pIter->iTnum = sqlite3_column_int(pIter->pIdxIter, 1);
            pIter->bUnique = sqlite3_column_int(pIter->pIdxIter, 2);
            rc = pIter->zIdx ? SQLITE_OK : SQLITE_NOMEM;
          }
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    rbuObjIterFinalize(pIter);
    p->rc = rc;
  }
  return rc;
}